

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeSIMDExtract(TranslateToFuzzReader *this,Type type)

{
  uint8_t index;
  BasicType BVar1;
  SIMDExtractOp op;
  FeatureOptions<wasm::SIMDExtractOp> *pFVar3;
  Expression *vec;
  SIMDExtract *pSVar4;
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>_>_>_>
  local_58;
  Type local_28;
  Type type_local;
  uint32_t uVar2;
  
  local_28.id = type.id;
  BVar1 = Type::getBasic(&local_28);
  switch(BVar1) {
  case none:
  case unreachable:
  case v128:
    wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0x11ab);
  case i32:
    op = Random::
         pick<wasm::SIMDExtractOp,wasm::SIMDExtractOp,wasm::SIMDExtractOp,wasm::SIMDExtractOp,wasm::SIMDExtractOp>
                   (&this->random,ExtractLaneSVecI8x16,ExtractLaneUVecI8x16,ExtractLaneSVecI16x8,
                    ExtractLaneUVecI16x8,ExtractLaneVecI32x4);
    break;
  case i64:
    op = ExtractLaneVecI64x2;
    goto LAB_00146059;
  case f32:
    local_58._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_58._M_impl.super__Rb_tree_header._M_header;
    local_58._M_impl._0_8_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right =
         local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    pFVar3 = Random::FeatureOptions<wasm::SIMDExtractOp>::add<>
                       ((FeatureOptions<wasm::SIMDExtractOp> *)&local_58,(FeatureSet)0x8,
                        ExtractLaneVecF32x4);
    pFVar3 = Random::FeatureOptions<wasm::SIMDExtractOp>::add<>
                       (pFVar3,(FeatureSet)0x40000,ExtractLaneVecF16x8);
    op = Random::pick<wasm::SIMDExtractOp>(&this->random,pFVar3);
    std::
    _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>_>_>_>
    ::~_Rb_tree(&local_58);
    break;
  case f64:
    op = ExtractLaneVecF64x2;
LAB_00146059:
    vec = make(this,(Type)0x6);
    goto switchD_00146051_caseD_5;
  default:
    vec = make(this,(Type)0x6);
    op = ExtractLaneSVecI8x16;
    goto switchD_00146051_caseD_0;
  }
  vec = make(this,(Type)0x6);
  switch(op) {
  case ExtractLaneSVecI8x16:
  case ExtractLaneUVecI8x16:
switchD_00146051_caseD_0:
    uVar2 = 0x10;
    break;
  case ExtractLaneSVecI16x8:
  case ExtractLaneUVecI16x8:
  case ExtractLaneVecF16x8:
    uVar2 = 8;
    break;
  case ExtractLaneVecI32x4:
  case ExtractLaneVecF32x4:
    uVar2 = 4;
    break;
  case ExtractLaneVecI64x2:
  case ExtractLaneVecF64x2:
switchD_00146051_caseD_5:
    uVar2 = 2;
    break;
  default:
    index = '\0';
    goto LAB_0014608e;
  }
  uVar2 = Random::upTo(&this->random,uVar2);
  index = (uint8_t)uVar2;
LAB_0014608e:
  pSVar4 = Builder::makeSIMDExtract(&this->builder,op,vec,index);
  return (Expression *)pSVar4;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDExtract(Type type) {
  auto op = static_cast<SIMDExtractOp>(0);
  switch (type.getBasic()) {
    case Type::i32:
      op = pick(ExtractLaneSVecI8x16,
                ExtractLaneUVecI8x16,
                ExtractLaneSVecI16x8,
                ExtractLaneUVecI16x8,
                ExtractLaneVecI32x4);
      break;
    case Type::i64:
      op = ExtractLaneVecI64x2;
      break;
    case Type::f32:
      op = pick(FeatureOptions<SIMDExtractOp>()
                  .add(FeatureSet::SIMD, ExtractLaneVecF32x4)
                  .add(FeatureSet::FP16, ExtractLaneVecF16x8));
      break;
    case Type::f64:
      op = ExtractLaneVecF64x2;
      break;
    case Type::v128:
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  Expression* vec = make(Type::v128);
  uint8_t index = 0;
  switch (op) {
    case ExtractLaneSVecI8x16:
    case ExtractLaneUVecI8x16:
      index = upTo(16);
      break;
    case ExtractLaneSVecI16x8:
    case ExtractLaneUVecI16x8:
    case ExtractLaneVecF16x8:
      index = upTo(8);
      break;
    case ExtractLaneVecI32x4:
    case ExtractLaneVecF32x4:
      index = upTo(4);
      break;
    case ExtractLaneVecI64x2:
    case ExtractLaneVecF64x2:
      index = upTo(2);
      break;
  }
  return builder.makeSIMDExtract(op, vec, index);
}